

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

CSerializedNetMsg * __thiscall CSerializedNetMsg::Copy(CSerializedNetMsg *this)

{
  long lVar1;
  CSerializedNetMsg *in_RDI;
  long in_FS_OFFSET;
  CSerializedNetMsg *copy;
  CSerializedNetMsg *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CSerializedNetMsg(in_stack_ffffffffffffffa8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&copy->data,&this->data);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
             in_stack_ffffffffffffffb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CSerializedNetMsg Copy() const
    {
        CSerializedNetMsg copy;
        copy.data = data;
        copy.m_type = m_type;
        return copy;
    }